

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

void __thiscall Output_Port::Destroy(Output_Port *this,Am_Constraint *self)

{
  bool bVar1;
  Am_Slot_Data *pAVar2;
  Am_Constraint_Tag constraint_tag;
  Am_Constraint_Tag tag;
  Am_Constraint *curr;
  Am_Constraint_Iterator iter;
  Am_Slot local_20;
  Am_Slot slot;
  Am_Constraint *self_local;
  Output_Port *this_local;
  
  local_20.data = (this->context).data;
  slot.data = (Am_Slot_Data *)self;
  Am_Slot::Am_Slot((Am_Slot *)&iter.current,(Am_Slot_Data *)0x0);
  (this->context).data = (Am_Slot_Data *)iter.current;
  if (this->next != (Output_Port *)0x0) {
    Destroy(this->next,(Am_Constraint *)slot.data);
    this->next = (Output_Port *)0x0;
  }
  Am_Constraint_Iterator::Am_Constraint_Iterator((Am_Constraint_Iterator *)&curr,&local_20);
  Am_Constraint_Iterator::Start((Am_Constraint_Iterator *)&curr);
  do {
    bVar1 = Am_Constraint_Iterator::Last((Am_Constraint_Iterator *)&curr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_00267b72:
      if (this != (Output_Port *)0x0) {
        operator_delete(this,0x10);
      }
      return;
    }
    pAVar2 = (Am_Slot_Data *)Am_Constraint_Iterator::Get((Am_Constraint_Iterator *)&curr);
    if (pAVar2 == slot.data) {
      constraint_tag = Am_Constraint_Iterator::Get_Tag((Am_Constraint_Iterator *)&curr);
      Am_Slot::Remove_Constraint(&local_20,constraint_tag);
      goto LAB_00267b72;
    }
    Am_Constraint_Iterator::Next((Am_Constraint_Iterator *)&curr);
  } while( true );
}

Assistant:

void Destroy(Am_Constraint *self)
  {
    Am_Slot slot = context;
    context = (Am_Slot_Data *)nullptr;
    if (next) {
      next->Destroy(self);
      next = nullptr;
    }
    Am_Constraint_Iterator iter(slot);
    Am_Constraint *curr;
    for (iter.Start(); !iter.Last(); iter.Next()) {
      curr = iter.Get();
      if (curr == self) {
        Am_Constraint_Tag tag = iter.Get_Tag();
        slot.Remove_Constraint(tag);
        break;
      }
    }
    delete this;
  }